

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

int chooseNumGamesToPlay(void)

{
  __type local_d;
  int local_c [2];
  int numGames;
  
  do {
    std::operator<<((ostream *)&std::cout,
                    "please choose the number of games to be played on each map (between 1 and 5) : \n"
                   );
    std::istream::operator>>((istream *)&std::cin,local_c);
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    std::istream::ignore((long)&std::cin,0x200);
    local_d = true;
    if ((0 < local_c[0]) && (local_d = true, local_c[0] < 6)) {
      local_d = std::isnan<int>(local_c[0]);
    }
  } while (local_d != false);
  return local_c[0];
}

Assistant:

static int chooseNumGamesToPlay() {
    int numGames;
    do {
        cout << "please choose the number of games to be played on each map (between 1 and 5) : \n";
        cin >> numGames;
        cin.clear();
        cin.ignore(512, '\n');
    } while (numGames < 1 || numGames > 5 || isnan(numGames));
    return int(numGames);
}